

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i_sound.cpp
# Opt level: O1

TArray<char,_char> __thiscall SoundDecoder::readAll(SoundDecoder *this)

{
  int iVar1;
  undefined8 extraout_RDX;
  long *in_RSI;
  uint amount;
  TArray<char,_char> TVar2;
  
  this->_vptr_SoundDecoder = (_func_int **)0x0;
  this[1]._vptr_SoundDecoder = (_func_int **)0x0;
  TArray<char,_char>::Resize((TArray<char,_char> *)this,0x8000);
  amount = 0;
  while( true ) {
    iVar1 = (**(code **)(*in_RSI + 8))();
    if (iVar1 == 0) break;
    amount = amount + iVar1;
    TArray<char,_char>::Resize((TArray<char,_char> *)this,amount * 2);
  }
  TArray<char,_char>::Resize((TArray<char,_char> *)this,amount);
  TVar2.Most = (int)extraout_RDX;
  TVar2.Count = (int)((ulong)extraout_RDX >> 0x20);
  TVar2.Array = (char *)this;
  return TVar2;
}

Assistant:

TArray<char> SoundDecoder::readAll()
{
    TArray<char> output;
    unsigned total = 0;
    unsigned got;

    output.Resize(total+32768);
    while((got=(unsigned)read(&output[total], output.Size()-total)) > 0)
    {
        total += got;
        output.Resize(total*2);
    }
    output.Resize(total);
    return output;
}